

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

SymbolVisibility __thiscall google::protobuf::Symbol::GetEffectiveVisibility(Symbol *this)

{
  uint8_t uVar1;
  int iVar2;
  bool bVar3;
  SymbolVisibility SVar4;
  FeatureSet *pFVar5;
  LogMessageFatal LStack_18;
  
  uVar1 = this->ptr_->symbol_type_;
  if (((uVar1 == '\x04') || (SVar4 = VISIBILITY_UNSET, uVar1 == '\x01')) &&
     (SVar4 = visibility_keyword(this), SVar4 == VISIBILITY_UNSET)) {
    pFVar5 = features(this);
    iVar2 = (pFVar5->field_0)._impl_.default_symbol_visibility_;
    if (iVar2 - 3U < 2) {
      SVar4 = VISIBILITY_LOCAL;
    }
    else if (iVar2 == 1) {
      SVar4 = VISIBILITY_EXPORT;
    }
    else {
      if (iVar2 != 2) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&LStack_18,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x3a1,"false");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
      }
      bVar3 = IsNestedDefinition(this);
      SVar4 = VISIBILITY_EXPORT - bVar3;
    }
  }
  return SVar4;
}

Assistant:

SymbolVisibility GetEffectiveVisibility() const {
    // Only Types have visibility
    if (!IsType()) {
      return SymbolVisibility::VISIBILITY_UNSET;
    }

    SymbolVisibility effective_visibility = visibility_keyword();

    // If our visibility is specifically set we can return that.  We'll validate
    // whether it's reasonable or not later.
    if (effective_visibility == SymbolVisibility::VISIBILITY_UNSET) {
      switch (features().default_symbol_visibility()) {
        case FeatureSet::VisibilityFeature::EXPORT_ALL:
          return SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::EXPORT_TOP_LEVEL:
          return IsNestedDefinition() ? SymbolVisibility::VISIBILITY_LOCAL
                                      : SymbolVisibility::VISIBILITY_EXPORT;
        case FeatureSet::VisibilityFeature::LOCAL_ALL:
        case FeatureSet::VisibilityFeature::STRICT:
          return SymbolVisibility::VISIBILITY_LOCAL;

        // Unset shouldn't be possible from the compiler without there being an
        // error (recursive import, for example), but happens in unit
        // tests so assume it represents pre-edition 2024 defaults. In either
        // case we want to fail open.  We have a DCHECK here to make sure it can
        // fail in tests, but not released code.
        case FeatureSet::VisibilityFeature::DEFAULT_SYMBOL_VISIBILITY_UNKNOWN:
        default:
          ABSL_DCHECK(false);
          return SymbolVisibility::VISIBILITY_EXPORT;
      }
    }

    return effective_visibility;
  }